

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base(any_executor_base *this)

{
  object_fns *poVar1;
  target_fns *ptVar2;
  any_executor_base *this_local;
  
  poVar1 = object_fns_table<void>((type *)0x0);
  this->object_fns_ = poVar1;
  this->target_ = (void *)0x0;
  ptVar2 = target_fns_table<void>((type *)0x0);
  this->target_fns_ = ptVar2;
  return;
}

Assistant:

any_executor_base() ASIO_NOEXCEPT
    : object_fns_(object_fns_table<void>()),
      target_(0),
      target_fns_(target_fns_table<void>())
  {
  }